

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_validate_bda_load_store(Impl *this,SPIRVModule *module)

{
  Id IVar1;
  SPIRVModule *module_local;
  Impl *this_local;
  
  if (this->validate_bda_load_store_call_id == 0) {
    IVar1 = build_validate_bda_load_store_function
                      (module,(this->instruction_instrumentation).info.control_desc_set,
                       (this->instruction_instrumentation).info.control_binding);
    this->validate_bda_load_store_call_id = IVar1;
  }
  return this->validate_bda_load_store_call_id;
}

Assistant:

spv::Id SPIRVModule::Impl::build_validate_bda_load_store(SPIRVModule &module)
{
	if (!validate_bda_load_store_call_id)
	{
		validate_bda_load_store_call_id = build_validate_bda_load_store_function(
			module,
			instruction_instrumentation.info.control_desc_set,
			instruction_instrumentation.info.control_binding);
	}

	return validate_bda_load_store_call_id;
}